

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

PropertyId Js::JavascriptProxy::EnsureHandlerPropertyId(ScriptContext *scriptContext)

{
  ThreadContext *this;
  char16_t *string;
  int iVar1;
  RecyclableData *pRVar2;
  Type *pTVar3;
  size_t sVar4;
  PropertyRecord *pPVar5;
  CharacterBuffer<char16_t> local_38;
  
  this = scriptContext->threadContext;
  iVar1 = this->handlerPropertyId;
  if (iVar1 == -1) {
    pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    if ((pRVar2->autoProxyName).ptr == (char16_t *)0x0) {
      pTVar3 = (Type *)&DAT_015bf350;
    }
    else {
      pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      pTVar3 = &pRVar2->autoProxyName;
    }
    string = pTVar3->ptr;
    sVar4 = PAL_wcslen(string);
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.string.ptr = string;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    local_38.len = (Type)sVar4;
    pPVar5 = ThreadContext::GetOrAddPropertyRecordBind(this,&local_38);
    iVar1 = pPVar5->pid;
    this->handlerPropertyId = iVar1;
  }
  return iVar1;
}

Assistant:

PropertyId JavascriptProxy::EnsureHandlerPropertyId(ScriptContext* scriptContext)
    {
        ThreadContext* threadContext = scriptContext->GetThreadContext();
        if (threadContext->handlerPropertyId == Js::Constants::NoProperty)
        {
            LPCWSTR autoProxyName;

            if (threadContext->GetAutoProxyName() != nullptr)
            {
                autoProxyName = threadContext->GetAutoProxyName();
            }
            else
            {
                autoProxyName = Js::Configuration::Global.flags.autoProxy;
            }

            threadContext->handlerPropertyId = threadContext->GetOrAddPropertyRecordBind(
                JsUtil::CharacterBuffer<WCHAR>(autoProxyName, static_cast<charcount_t>(wcslen(autoProxyName))))->GetPropertyId();
        }
        return threadContext->handlerPropertyId;
    }